

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O3

void __thiscall QPlainTextEditPrivate::cursorPositionChanged(QPlainTextEditPrivate *this)

{
  QObject *pQVar1;
  long in_FS_OFFSET;
  QWidgetTextControl aQStack_48 [8];
  code *local_40;
  undefined1 *local_38;
  QObject *local_30;
  undefined4 local_28;
  undefined4 local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this->field_0x348 = this->field_0x348 & 0xbf;
  pQVar1 = *(QObject **)
            &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
             field_0x8;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  QWidgetTextControl::textCursor(aQStack_48);
  local_24 = QTextCursor::position();
  local_28 = 0xffffffff;
  local_40 = QTextCursor::isNull;
  local_38 = (undefined1 *)CONCAT44(local_38._4_4_,0x11b);
  local_30 = pQVar1;
  QTextCursor::~QTextCursor((QTextCursor *)aQStack_48);
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_40);
  QMetaObject::activate(pQVar1,&QPlainTextEdit::staticMetaObject,5,(void **)0x0);
  QAccessibleTextCursorEvent::~QAccessibleTextCursorEvent((QAccessibleTextCursorEvent *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextEditPrivate::cursorPositionChanged()
{
    pageUpDownLastCursorYIsValid = false;
    Q_Q(QPlainTextEdit);
#if QT_CONFIG(accessibility)
    QAccessibleTextCursorEvent ev(q, q->textCursor().position());
    QAccessible::updateAccessibility(&ev);
#endif
    emit q->cursorPositionChanged();
}